

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NodeFindFanin(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(pNode->vFanins).nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar2]] == pFanin) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return -1;
}

Assistant:

int Abc_NodeFindFanin( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pThis;
    int i;
    Abc_ObjForEachFanin( pNode, pThis, i )
        if ( pThis == pFanin )
            return i;
    return -1;
}